

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apu.cpp
# Opt level: O0

MixMode __thiscall
trackerboy::apu::Hardware::preRunChannel
          (Hardware *this,size_t index,Channel *ch,Mixer *mixer,uint32_t cycletime)

{
  bool bVar1;
  reference pvVar2;
  uint32_t cycletime_local;
  Mixer *mixer_local;
  Channel *ch_local;
  size_t index_local;
  Hardware *this_local;
  
  bVar1 = Channel::isDacOn(ch);
  if ((bVar1) && (bVar1 = Channel::isEnabled(ch), bVar1)) {
    pvVar2 = std::array<trackerboy::apu::MixMode,_4UL>::operator[](&this->mMix,index);
    this_local._4_4_ = *pvVar2;
  }
  else {
    silence(this,index,mixer,cycletime);
    this_local._4_4_ = mute;
  }
  return this_local._4_4_;
}

Assistant:

MixMode Hardware::preRunChannel(size_t index, Channel &ch, Mixer &mixer, uint32_t cycletime) noexcept {
    if (ch.isDacOn() && ch.isEnabled()) {
        return mMix[index];
    }

    // no mixing required, either the channel's DAC is off or
    // the length counter disabled the channel
    silence(index, mixer, cycletime);
    return MixMode::mute;

}